

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

WaitForLineResult
cmSystemTools::WaitForLine
          (uv_loop_t *loop,uv_stream_t *outPipe,uv_stream_t *errPipe,string *line,cmDuration timeout
          ,vector<char,_std::allocator<char>_> *out,vector<char,_std::allocator<char>_> *err)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  vector<char,std::allocator<char>> *pvVar4;
  uv_stream_t *stream;
  const_iterator __cbeg_2;
  pointer pcVar5;
  iterator __beg;
  WaitForLineResult unaff_EBP;
  pointer pcVar6;
  pointer pcVar7;
  difference_type __offset;
  pointer pcVar8;
  difference_type __offset_1;
  pointer pcVar9;
  pointer pcVar10;
  iterator __beg_1;
  long lVar11;
  cmProcessOutput processOutput;
  bool timedOut;
  string strdata;
  uv_timer_ptr timer;
  ReadData errData;
  ReadData outData;
  cmProcessOutput local_13a;
  char local_139;
  vector<char,std::allocator<char>> *local_138;
  cmUVStreamReadHandle *local_130;
  cmUVStreamReadHandle *local_128;
  string *local_120;
  string local_118;
  double local_f8;
  uv_stream_t *local_e8;
  uv_loop_t *local_e0;
  uv_handle_ptr_base_<uv_timer_s> local_d8;
  uv_stream_t *local_c8;
  char *local_c0;
  undefined2 uStack_b8;
  undefined6 uStack_b6;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  char cStack_a8;
  char cStack_a7;
  uv_stream_t *local_a0;
  char *local_98;
  undefined2 uStack_90;
  undefined6 uStack_8e;
  undefined2 uStack_88;
  undefined6 uStack_86;
  char cStack_80;
  char cStack_7f;
  string local_78;
  string local_58;
  ulong local_38;
  
  line->_M_string_length = 0;
  *(line->_M_dataplus)._M_p = '\0';
  pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar9 = (err->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_138 = (vector<char,std::allocator<char>> *)err;
  local_120 = line;
  local_f8 = timeout.__r;
  local_e8 = errPipe;
  local_e0 = loop;
  cmProcessOutput::cmProcessOutput(&local_13a,Auto,0x400);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_38 = (ulong)(local_f8 * 1000.0);
  local_38 = (long)(local_f8 * 1000.0 - 9.223372036854776e+18) & (long)local_38 >> 0x3f | local_38;
  do {
    pvVar4 = local_138;
    pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish;
    pcVar5 = pcVar8;
    if (pcVar8 != pcVar10) {
      lVar11 = 0;
      do {
        cVar1 = pcVar8[lVar11];
        if (cVar1 == '\r') {
          if (pcVar8 + lVar11 + 1 == pcVar10) {
            pcVar5 = pcVar8 + lVar11;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pcVar9 = pcVar8 + lVar11;
          if ((1 < (ulong)((long)pcVar9 - (long)pcVar10)) || (pcVar9 != pcVar10)) {
            std::__cxx11::string::append((char *)local_120,(ulong)pcVar10);
            pcVar10 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          }
          pcVar5 = pcVar8 + lVar11 + 1;
          unaff_EBP = STDOUT;
          if (pcVar5 != pcVar10) {
            pcVar7 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            pcVar6 = pcVar9 + 1;
            if (pcVar5 != pcVar7) {
              memmove(pcVar10,pcVar9 + 1,(size_t)(pcVar7 + (~(ulong)pcVar8 - lVar11)));
              pcVar5 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              pcVar6 = pcVar5;
            }
            if (pcVar5 + ~(ulong)pcVar8 + (long)pcVar10 + -lVar11 != pcVar6) {
              (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_finish = pcVar5 + ~(ulong)pcVar8 + (long)pcVar10 + -lVar11;
            }
          }
          goto LAB_001b6dfd;
        }
        lVar2 = lVar11 + 1;
        lVar11 = lVar11 + 1;
        pcVar5 = pcVar10;
      } while (pcVar8 + lVar2 != pcVar10);
    }
    pcVar8 = *(pointer *)(local_138 + 8);
    pcVar10 = pcVar9;
    if (pcVar9 != pcVar8) {
      lVar11 = 0;
      do {
        cVar1 = pcVar9[lVar11];
        if (cVar1 == '\r') {
          if (pcVar9 + lVar11 + 1 == pcVar8) {
            pcVar10 = pcVar9 + lVar11;
            break;
          }
        }
        else if ((cVar1 == '\0') || (cVar1 == '\n')) {
          pcVar10 = *(pointer *)local_138;
          pcVar8 = pcVar9 + lVar11;
          if ((1 < (ulong)((long)pcVar8 - (long)pcVar10)) || (pcVar8 != pcVar10)) {
            std::__cxx11::string::append((char *)local_120,(ulong)pcVar10);
            pcVar10 = *(pointer *)pvVar4;
          }
          pcVar5 = pcVar9 + lVar11 + 1;
          unaff_EBP = STDERR;
          if (pcVar5 != pcVar10) {
            pcVar7 = pcVar8 + 1;
            if (pcVar5 != *(pointer *)(pvVar4 + 8)) {
              memmove(pcVar10,pcVar8 + 1,
                      (size_t)(*(pointer *)(pvVar4 + 8) + (~(ulong)pcVar9 - lVar11)));
              pcVar5 = *(pointer *)(pvVar4 + 8);
              pcVar7 = pcVar5;
            }
            if (pcVar5 + ~(ulong)pcVar9 + (long)pcVar10 + -lVar11 != pcVar7) {
              *(pointer *)(pvVar4 + 8) = pcVar5 + ~(ulong)pcVar9 + (long)pcVar10 + -lVar11;
            }
          }
          goto LAB_001b6dfd;
        }
        lVar2 = lVar11 + 1;
        lVar11 = lVar11 + 1;
        pcVar10 = pcVar8;
      } while (pcVar9 + lVar2 != pcVar8);
    }
    local_f8 = (double)CONCAT44(local_f8._4_4_,unaff_EBP);
    uStack_88 = 0;
    uStack_86 = 0;
    cStack_80 = '\0';
    cStack_7f = '\0';
    local_98 = (char *)0x0;
    uStack_90 = 0;
    uStack_8e = 0;
    local_a0 = outPipe;
    local_128 = (cmUVStreamReadHandle *)operator_new(0x58);
    (local_128->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_128->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_128->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(uv_stream_t ***)&(local_128->OnRead).super__Function_base._M_functor = &local_a0;
    *(undefined8 *)((long)&(local_128->OnRead).super__Function_base._M_functor + 8) = 0;
    (local_128->OnRead).super__Function_base._M_manager =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2303:9)>
         ::_M_manager;
    (local_128->OnRead)._M_invoker =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2303:9)>
         ::_M_invoke;
    *(uv_stream_t ***)&(local_128->OnFinish).super__Function_base._M_functor = &local_a0;
    *(undefined8 *)((long)&(local_128->OnFinish).super__Function_base._M_functor + 8) = 0;
    (local_128->OnFinish).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2308:9)>
         ::_M_manager;
    (local_128->OnFinish)._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2308:9)>
         ::_M_invoke;
    outPipe->data = local_128;
    uv_read_start(outPipe,cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2303:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2308:9)>
                          ::anon_class_1_0_00000001::__invoke,
                  cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2303:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2308:9)>
                  ::anon_class_1_0_00000001::__invoke);
    stream = local_e8;
    uStack_b0 = 0;
    uStack_ae = 0;
    cStack_a8 = '\0';
    cStack_a7 = '\0';
    local_c0 = (char *)0x0;
    uStack_b8 = 0;
    uStack_b6 = 0;
    local_c8 = local_e8;
    local_130 = (cmUVStreamReadHandle *)operator_new(0x58);
    (local_130->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_130->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_130->Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(uv_stream_t ***)&(local_130->OnRead).super__Function_base._M_functor = &local_c8;
    *(undefined8 *)((long)&(local_130->OnRead).super__Function_base._M_functor + 8) = 0;
    (local_130->OnRead).super__Function_base._M_manager =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2303:9)>
         ::_M_manager;
    (local_130->OnRead)._M_invoker =
         std::
         _Function_handler<void_(std::vector<char,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2303:9)>
         ::_M_invoke;
    *(uv_stream_t ***)&(local_130->OnFinish).super__Function_base._M_functor = &local_c8;
    *(undefined8 *)((long)&(local_130->OnFinish).super__Function_base._M_functor + 8) = 0;
    (local_130->OnFinish).super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2308:9)>
         ::_M_manager;
    (local_130->OnFinish)._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2308:9)>
         ::_M_invoke;
    stream->data = local_130;
    uv_read_start(stream,cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2303:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2308:9)>
                         ::anon_class_1_0_00000001::__invoke,
                  cmUVStreamRead<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2303:9),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:2308:9)>
                  ::anon_class_1_0_00000001::__invoke);
    local_d8.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_d8.handle.super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_139 = '\0';
    ::cm::uv_timer_ptr::init((uv_timer_ptr *)&local_d8,(EVP_PKEY_CTX *)local_e0);
    unaff_EBP = local_f8._0_4_;
    ::cm::uv_timer_ptr::start
              ((uv_timer_ptr *)&local_d8,WaitForLine::anon_class_1_0_00000001::__invoke,local_38,0);
    uv_run(local_e0,UV_RUN_ONCE);
    if (local_139 != '\0') {
      unaff_EBP = Timeout;
      goto LAB_001b69ba;
    }
    if (cStack_80 == '\x01') {
      cmProcessOutput::DecodeText
                (&local_13a,local_98,CONCAT62(uStack_8e,uStack_90) - (long)local_98,&local_118,1);
      pcVar5 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<char,std::allocator<char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<char,std::allocator<char>> *)out,pcVar5,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      pcVar5 = pcVar5 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                               super__Vector_impl_data._M_start - (long)pcVar8);
LAB_001b6bd2:
      if (cStack_7f == '\0') {
        uv_read_stop(outPipe);
      }
      bVar3 = true;
      if (cStack_a7 == '\0') {
        uv_read_stop(local_e8);
      }
    }
    else {
      if (cStack_a8 == '\x01') {
        cmProcessOutput::DecodeText
                  (&local_13a,local_c0,CONCAT62(uStack_b6,uStack_b8) - (long)local_c0,&local_118,2);
        pvVar4 = local_138;
        lVar11 = *(long *)(local_138 + 8);
        lVar2 = *(long *)local_138;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (local_138,lVar11,local_118._M_dataplus._M_p,
                   local_118._M_dataplus._M_p + local_118._M_string_length);
        pcVar10 = (pointer)((lVar11 - lVar2) + *(long *)pvVar4);
        goto LAB_001b6bd2;
      }
      if ((cStack_7f != '\x01') || (cStack_a7 != '\x01')) goto LAB_001b6bd2;
      local_58._M_string_length = 0;
      local_58.field_2._M_local_buf[0] = '\0';
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      cmProcessOutput::DecodeText(&local_13a,&local_58,&local_118,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,
                        CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                 local_58.field_2._M_local_buf[0]) + 1);
      }
      if (local_118._M_string_length != 0) {
        pcVar5 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((vector<char,std::allocator<char>> *)out,pcVar5,local_118._M_dataplus._M_p,
                   local_118._M_dataplus._M_p + local_118._M_string_length);
        pcVar5 = pcVar5 + ((long)(out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                                 super__Vector_impl_data._M_start - (long)pcVar8);
      }
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      cmProcessOutput::DecodeText(&local_13a,&local_78,&local_118,2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      pvVar4 = local_138;
      if (local_118._M_string_length != 0) {
        lVar11 = *(long *)(local_138 + 8);
        lVar2 = *(long *)local_138;
        std::vector<char,std::allocator<char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (local_138,lVar11,local_118._M_dataplus._M_p,
                   local_118._M_dataplus._M_p + local_118._M_string_length);
        pcVar10 = (pointer)((lVar11 - lVar2) + *(long *)pvVar4);
      }
      pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (pcVar8 == (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        if (*(pointer *)local_138 != *(pointer *)(local_138 + 8)) {
          std::__cxx11::string::append((char *)local_120,(ulong)*(pointer *)local_138);
          unaff_EBP = STDERR;
          if (*(pointer *)local_138 != *(pointer *)(local_138 + 8)) {
            *(pointer *)(local_138 + 8) = *(pointer *)local_138;
          }
          goto LAB_001b69ba;
        }
        bVar3 = false;
        unaff_EBP = None;
      }
      else {
        std::__cxx11::string::append((char *)local_120,(ulong)pcVar8);
        pcVar8 = (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        unaff_EBP = STDOUT;
        if (pcVar8 != (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          (out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
          _M_finish = pcVar8;
        }
LAB_001b69ba:
        bVar3 = false;
      }
    }
    ::cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_(&local_d8);
    if (local_130 != (cmUVStreamReadHandle *)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&local_130,local_130);
    }
    if (local_c0 != (char *)0x0) {
      operator_delete(local_c0,CONCAT62(uStack_ae,uStack_b0) - (long)local_c0);
    }
    if (local_128 != (cmUVStreamReadHandle *)0x0) {
      std::default_delete<cmUVStreamReadHandle>::operator()
                ((default_delete<cmUVStreamReadHandle> *)&local_128,local_128);
    }
    if (local_98 != (char *)0x0) {
      operator_delete(local_98,CONCAT62(uStack_86,uStack_88) - (long)local_98);
    }
    pcVar8 = pcVar5;
    pcVar9 = pcVar10;
    if (!bVar3) {
LAB_001b6dfd:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

cmSystemTools::WaitForLineResult cmSystemTools::WaitForLine(
  uv_loop_t* loop, uv_stream_t* outPipe, uv_stream_t* errPipe,
  std::string& line, cmDuration timeout, std::vector<char>& out,
  std::vector<char>& err)
{
  line.clear();
  auto outiter = out.begin();
  auto erriter = err.begin();
  cmProcessOutput processOutput;
  std::string strdata;
  while (true) {
    // Check for a newline in stdout.
    for (; outiter != out.end(); ++outiter) {
      if ((*outiter == '\r') && ((outiter + 1) == out.end())) {
        break;
      }
      if (*outiter == '\n' || *outiter == '\0') {
        std::vector<char>::size_type length = outiter - out.begin();
        if (length > 1 && *(outiter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(out.data(), length);
        }
        out.erase(out.begin(), outiter + 1);
        return WaitForLineResult::STDOUT;
      }
    }

    // Check for a newline in stderr.
    for (; erriter != err.end(); ++erriter) {
      if ((*erriter == '\r') && ((erriter + 1) == err.end())) {
        break;
      }
      if (*erriter == '\n' || *erriter == '\0') {
        std::vector<char>::size_type length = erriter - err.begin();
        if (length > 1 && *(erriter - 1) == '\r') {
          --length;
        }
        if (length > 0) {
          line.append(err.data(), length);
        }
        err.erase(err.begin(), erriter + 1);
        return WaitForLineResult::STDERR;
      }
    }

    // No newlines found.  Wait for more data from the process.
    struct ReadData
    {
      uv_stream_t* Stream;
      std::vector<char> Buffer;
      bool Read = false;
      bool Finished = false;
    };
    auto startRead =
      [](uv_stream_t* stream,
         ReadData& data) -> std::unique_ptr<cmUVStreamReadHandle> {
      data.Stream = stream;
      return cmUVStreamRead(
        stream,
        [&data](std::vector<char> buf) {
          data.Buffer = std::move(buf);
          data.Read = true;
          uv_read_stop(data.Stream);
        },
        [&data]() { data.Finished = true; });
    };
    ReadData outData;
    auto outHandle = startRead(outPipe, outData);
    ReadData errData;
    auto errHandle = startRead(errPipe, errData);

    cm::uv_timer_ptr timer;
    bool timedOut = false;
    timer.init(*loop, &timedOut);
    timer.start(
      [](uv_timer_t* handle) {
        auto* timedOutPtr = static_cast<bool*>(handle->data);
        *timedOutPtr = true;
      },
      static_cast<uint64_t>(timeout.count() * 1000.0), 0);

    uv_run(loop, UV_RUN_ONCE);
    if (timedOut) {
      // Timeout has been exceeded.
      return WaitForLineResult::Timeout;
    }
    if (outData.Read) {
      processOutput.DecodeText(outData.Buffer.data(), outData.Buffer.size(),
                               strdata, 1);
      // Append to the stdout buffer.
      std::vector<char>::size_type size = out.size();
      cm::append(out, strdata);
      outiter = out.begin() + size;
    } else if (errData.Read) {
      processOutput.DecodeText(errData.Buffer.data(), errData.Buffer.size(),
                               strdata, 2);
      // Append to the stderr buffer.
      std::vector<char>::size_type size = err.size();
      cm::append(err, strdata);
      erriter = err.begin() + size;
    } else if (outData.Finished && errData.Finished) {
      // Both stdout and stderr pipes have broken.  Return leftover data.
      processOutput.DecodeText(std::string(), strdata, 1);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = out.size();
        cm::append(out, strdata);
        outiter = out.begin() + size;
      }
      processOutput.DecodeText(std::string(), strdata, 2);
      if (!strdata.empty()) {
        std::vector<char>::size_type size = err.size();
        cm::append(err, strdata);
        erriter = err.begin() + size;
      }
      if (!out.empty()) {
        line.append(out.data(), outiter - out.begin());
        out.erase(out.begin(), out.end());
        return WaitForLineResult::STDOUT;
      }
      if (!err.empty()) {
        line.append(err.data(), erriter - err.begin());
        err.erase(err.begin(), err.end());
        return WaitForLineResult::STDERR;
      }
      return WaitForLineResult::None;
    }
    if (!outData.Finished) {
      uv_read_stop(outPipe);
    }
    if (!errData.Finished) {
      uv_read_stop(errPipe);
    }
  }
}